

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

void __thiscall crnlib::dxt_hc::determine_tiles_task_etc(dxt_hc *this,uint64 data,void *param_2)

{
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar1;
  color_quad_u8 *pcVar2;
  float fVar3;
  color_quad_u8 (*pacVar4) [16];
  double dVar5;
  byte *pbVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint e;
  uint *puVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  byte *pbVar14;
  uchar uVar15;
  float fVar16;
  uint t;
  ulong uVar17;
  tile_details *this_00;
  float fVar18;
  float (*local_2f0) [8];
  undefined1 local_2e8 [40];
  ulong local_2c0;
  ulong local_2b8;
  long local_2b0;
  params params;
  int scan [3];
  uint total_error [3];
  int refine [4];
  results results;
  uint tile_error [5];
  color_quad_u8 tilePixels [32];
  vec6F local_170;
  uint8 selectors [32];
  etc1_optimizer optimizer;
  
  uVar12 = this->m_pTask_pool->m_num_threads;
  etc1_optimizer::etc1_optimizer(&optimizer);
  etc1_optimizer::params::params(&params);
  local_2e8._8_8_ = ZEXT48(uVar12 + 1);
  params.m_use_color4 = false;
  params.m_constrain_against_base_color5 = false;
  scan[0] = -1;
  scan[1] = 0;
  scan[2] = 1;
  refine[0] = -3;
  refine[1] = -2;
  refine[2] = 2;
  refine[3] = 3;
  local_2e8._32_8_ = (this->m_params).m_levels;
  local_2e8._24_8_ = data + 1;
  local_2f0 = this->m_color_derating;
  uVar17 = 0;
  local_2e8._16_8_ = data;
  while (uVar17 < (this->m_params).m_num_levels) {
    fVar3 = ((anon_struct_16_4_e4b8e16b *)(local_2e8._32_8_ + uVar17 * 0x10))->m_weight;
    fVar16 = (float)((int)(((ulong)((anon_struct_16_4_e4b8e16b *)(local_2e8._32_8_ + uVar17 * 0x10))
                                   ->m_num_blocks * local_2e8._16_8_) / (ulong)local_2e8._8_8_) +
                     ((anon_struct_16_4_e4b8e16b *)(local_2e8._32_8_ + uVar17 * 0x10))->
                     m_first_block & 0xfffffffe);
    local_2b8 = (ulong)((int)(((ulong)((anon_struct_16_4_e4b8e16b *)
                                      (local_2e8._32_8_ + uVar17 * 0x10))->m_num_blocks *
                              local_2e8._24_8_) / (ulong)local_2e8._8_8_) +
                        ((anon_struct_16_4_e4b8e16b *)(local_2e8._32_8_ + uVar17 * 0x10))->
                        m_first_block & 0xfffffffe);
    local_2c0 = uVar17;
    while( true ) {
      if ((uint)(float)local_2b8 <= (uint)fVar16) break;
      pacVar4 = this->m_blocks;
      uVar17 = (ulong)((uint)fVar16 >> 1);
      uVar7 = 0;
      for (uVar8 = 0; uVar8 != 0x10; uVar8 = uVar8 + 1) {
        uVar13 = (uint)(uVar8 >> 2) & 0x3fffffff | uVar7 & 0xc;
        tilePixels[uVar8].field_0.field_0.r = pacVar4[uVar17][uVar13].field_0.field_0.r;
        tilePixels[uVar8].field_0.field_0.g = pacVar4[uVar17][uVar13].field_0.field_0.g;
        tilePixels[uVar8].field_0.field_0.b = pacVar4[uVar17][uVar13].field_0.field_0.b;
        tilePixels[uVar8].field_0.field_0.a = pacVar4[uVar17][uVar13].field_0.field_0.a;
        uVar7 = uVar7 + 4;
      }
      local_2b0 = uVar17 * 0x40;
      paVar1 = &pacVar4[uVar17][8].field_0;
      tilePixels._112_8_ = *(undefined8 *)(pacVar4[uVar17] + 0xc);
      tilePixels._120_8_ = *(undefined8 *)(pacVar4[uVar17] + 0xc + 2);
      tilePixels[0x18].field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)&paVar1->field_0;
      tilePixels[0x19].field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)&paVar1[1].field_0;
      tilePixels[0x1a].field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)&paVar1[2].field_0;
      tilePixels[0x1b].field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)&paVar1[3].field_0;
      tilePixels._80_8_ = *(undefined8 *)(pacVar4[uVar17] + 4);
      tilePixels._88_8_ = *(undefined8 *)(pacVar4[uVar17] + 4 + 2);
      tilePixels._64_8_ = *(undefined8 *)pacVar4[uVar17];
      tilePixels._72_8_ = *(undefined8 *)(pacVar4[uVar17] + 2);
      puVar10 = &DAT_0018d290;
      for (uVar17 = 0; uVar17 != 5; uVar17 = uVar17 + 1) {
        params.m_num_src_pixels = 8 << ((byte)(uVar17 >> 2) & 0x1f);
        params.m_pSrc_pixels = tilePixels + *puVar10;
        etc1_optimizer::init(&optimizer,(EVP_PKEY_CTX *)&params);
        params.m_scan_delta_size = 3;
        params.m_pScan_deltas = scan;
        etc1_optimizer::compute(&optimizer);
        if (params.m_num_src_pixels * 0x177 < results.m_error) {
          params.m_pScan_deltas = refine;
          params.m_scan_delta_size = 4;
          etc1_optimizer::compute(&optimizer);
        }
        tile_error[uVar17] = (uint)results.m_error;
        puVar10 = puVar10 + 1;
      }
      pbVar6 = &DAT_0018d2a4;
      uVar17 = 0;
      while (uVar17 != 3) {
        uVar12 = 0;
        pbVar14 = pbVar6;
        for (uVar8 = uVar17 + 1 & 0xffffffff; (byte)uVar8 != 0;
            uVar8 = (ulong)(byte)((byte)uVar8 >> 1)) {
          uVar12 = uVar12 + tile_error[*pbVar14];
          pbVar14 = pbVar14 + 1;
        }
        total_error[uVar17] = uVar12;
        pbVar6 = pbVar6 + 2;
        uVar17 = uVar17 + 1;
      }
      fVar18 = 0.0;
      uVar17 = 0;
      for (uVar8 = 0; uVar8 != 3; uVar8 = uVar8 + 1) {
        dVar5 = 999999.0;
        if (total_error[uVar8] != 0) {
          dVar5 = log10(255.0 / SQRT((double)total_error[uVar8] / 48.0));
          dVar5 = dVar5 * 20.0;
        }
        dVar5 = dVar5 - (double)(*local_2f0)[uVar8];
        if (dVar5 <= 0.0) {
          dVar5 = 0.0;
        }
        if (fVar18 < (float)dVar5) {
          uVar17 = uVar8 & 0xffffffff;
          fVar18 = (float)dVar5;
        }
      }
      if (this->m_num_alpha_blocks == 0) {
        local_2e8._0_4_ = 0.0;
        local_2e8._4_4_ = 0.0;
      }
      else {
        palettize_alpha((dxt_hc *)local_2e8,(color_quad_u8 *)this,(uint)tilePixels,0x10);
      }
      lVar11 = 0;
      for (uVar7 = (uint)uVar17 + 1; uVar7 != 0; uVar7 = uVar7 >> 1) {
        this_00 = (this->m_tiles).m_p + ((uint)fVar16 | (uint)lVar11);
        vector<crnlib::color_quad<unsigned_char,_int>_>::append
                  (&this_00->pixels,
                   tilePixels + (uint)(&DAT_0018d290)[(byte)(&DAT_0018d2a4)[uVar17 * 2 + lVar11]],
                   8 << ((byte)(&DAT_0018d2a4)[uVar17 * 2 + lVar11] >> 2 & 0x1f));
        this_00->weight = fVar3;
        palettize_color(&local_170,this,(this_00->pixels).m_p,(this_00->pixels).m_size);
        vec<6U,_float>::operator=(&this_00->color_endpoint,&local_170);
        if (this->m_num_alpha_blocks != 0) {
          vec<2U,_float>::operator=(this_00->alpha_endpoints,(vec<2U,_float> *)local_2e8);
        }
        lVar11 = lVar11 + 1;
      }
      for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
        uVar9 = uVar8 | (uint)fVar16;
        (this->m_block_encodings).m_p[uVar9] = (uchar)uVar17;
        uVar15 = (uchar)uVar17;
        if (uVar8 == 0) {
          uVar15 = '\0';
        }
        (this->m_tile_indices).m_p[uVar9] =
             (uint)(byte)(&DAT_0018d2aa)[uVar8 + uVar17 * 2] | (uint)fVar16;
        (this->m_endpoint_indices).m_p[uVar9].reference = uVar15;
      }
      if (1 < (uint)uVar17) {
        pacVar4 = this->m_blocks;
        pcVar2 = (color_quad_u8 *)((long)&(*pacVar4)[0xc].field_0 + local_2b0);
        *(undefined8 *)pcVar2 = tilePixels._48_8_;
        *(undefined8 *)(pcVar2 + 2) = tilePixels._56_8_;
        pcVar2 = (color_quad_u8 *)((long)&(*pacVar4)[8].field_0 + local_2b0);
        *(undefined8 *)pcVar2 = tilePixels._32_8_;
        *(undefined8 *)(pcVar2 + 2) = tilePixels._40_8_;
        pcVar2 = (color_quad_u8 *)((long)&(*pacVar4)[4].field_0 + local_2b0);
        *(undefined8 *)pcVar2 = tilePixels._16_8_;
        *(undefined8 *)(pcVar2 + 2) = tilePixels._24_8_;
        pcVar2 = (color_quad_u8 *)((long)&(*pacVar4)[0].field_0 + local_2b0);
        *(undefined8 *)pcVar2 = tilePixels._0_8_;
        *(undefined8 *)(pcVar2 + 2) = tilePixels._8_8_;
      }
      fVar16 = (float)((int)fVar16 + 2);
    }
    local_2f0 = local_2f0 + 1;
    uVar17 = local_2c0 + 1;
  }
  etc1_optimizer::~etc1_optimizer(&optimizer);
  return;
}

Assistant:

void dxt_hc::determine_tiles_task_etc(uint64 data, void*)
    {
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        uint offsets[5] = { 0, 8, 16, 24, 16 };
        uint8 tiles[3][2] = { { 4 }, { 2, 3 }, { 0, 1 } };
        uint8 tile_map[3][2] = { { 0, 0 }, { 0, 1 }, { 0, 1 } };
        color_quad_u8 tilePixels[32];
        uint8 selectors[32];
        uint tile_error[5];
        uint total_error[3];

        etc1_optimizer optimizer;
        etc1_optimizer::params params;
        params.m_use_color4 = false;
        params.m_constrain_against_base_color5 = false;
        etc1_optimizer::results results;
        results.m_pSelectors = selectors;
        int scan[] = { -1, 0, 1 };
        int refine[] = { -3, -2, 2, 3 };

        for (uint level = 0; level < m_params.m_num_levels; level++)
        {
            float weight = m_params.m_levels[level].m_weight;
            uint b = (m_params.m_levels[level].m_first_block + m_params.m_levels[level].m_num_blocks * data / num_tasks) & ~1;
            uint bEnd = (m_params.m_levels[level].m_first_block + m_params.m_levels[level].m_num_blocks * (data + 1) / num_tasks) & ~1;
            for (; b < bEnd; b += 2)
            {
                for (uint p = 0; p < 16; p++)
                {
                    tilePixels[p] = m_blocks[b >> 1][(p << 2 & 12) | p >> 2];
                }
                memcpy(tilePixels + 16, m_blocks[b >> 1], 64);
                for (uint t = 0; t < 5; t++)
                {
                    params.m_pSrc_pixels = tilePixels + offsets[t];
                    params.m_num_src_pixels = results.m_n = 8 << (t >> 2);
                    optimizer.init(params, results);
                    params.m_pScan_deltas = scan;
                    params.m_scan_delta_size = sizeof(scan) / sizeof(*scan);
                    optimizer.compute();
                    if (results.m_error > 375 * params.m_num_src_pixels)
                    {
                        params.m_pScan_deltas = refine;
                        params.m_scan_delta_size = sizeof(refine) / sizeof(*refine);
                        optimizer.compute();
                    }
                    tile_error[t] = results.m_error;
                }

                for (uint8 e = 0; e < 3; e++)
                {
                    total_error[e] = 0;
                    for (uint8 t = 0, s = e + 1; s; s >>= 1, t++)
                    {
                        total_error[e] += tile_error[tiles[e][t]];
                    }
                }

                float best_quality = 0.0f;
                uint best_encoding = 0;
                for (uint e = 0; e < 3; e++)
                {
                    float quality = 0;
                    double peakSNR = total_error[e] ? log10(255.0f / sqrt(total_error[e] / 48.0)) * 20.0f : 999999.0f;
                    quality = (float)math::maximum<double>(peakSNR - m_color_derating[level][e], 0.0f);
                    if (quality > best_quality)
                    {
                        best_quality = quality;
                        best_encoding = e;
                    }
                }

                vec2F alpha_endpoints = m_num_alpha_blocks ? palettize_alpha(tilePixels, 16, 3) : vec2F(cClear);
                for (uint tile_index = 0, s = best_encoding + 1; s; s >>= 1, tile_index++)
                {
                    tile_details& tile = m_tiles[b | tile_index];
                    uint t = tiles[best_encoding][tile_index];
                    tile.pixels.append(tilePixels + offsets[t], 8 << (t >> 2));
                    tile.weight = weight;
                    tile.color_endpoint = palettize_color(tile.pixels.get_ptr(), tile.pixels.size());
                    if (m_num_alpha_blocks)
                    {
                        tile.alpha_endpoints[0] = alpha_endpoints;
                    }
                }

                for (uint bx = 0; bx < 2; bx++)
                {
                    m_block_encodings[b | bx] = best_encoding;
                    m_tile_indices[b | bx] = b | tile_map[best_encoding][bx];
                    m_endpoint_indices[b | bx].reference = bx ? best_encoding : 0;
                }
                if (best_encoding >> 1)
                {
                    memcpy(m_blocks[b >> 1], tilePixels, 64);
                }
            }
        }
    }